

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuaternion.h
# Opt level: O0

btQuaternion shortestArcQuat(btVector3 *v0,btVector3 *v1)

{
  btScalar *pbVar1;
  btScalar *_x;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar2;
  btVector3 bVar3;
  btScalar rs;
  btScalar s;
  btVector3 unused;
  btVector3 n;
  btScalar d;
  btVector3 c;
  btScalar *in_stack_ffffffffffffff78;
  btScalar *in_stack_ffffffffffffff80;
  btVector3 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  btVector3 local_54;
  btVector3 local_44;
  btScalar local_34;
  btQuadWord local_10;
  
  bVar3 = btVector3::cross((btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
  local_34 = btVector3::dot(in_RDI,in_RSI);
  if (-0.9999999 <= local_34) {
    bVar2 = btSqrt(0.0);
    btVector3::getX((btVector3 *)&stack0xffffffffffffffd0);
    btVector3::getY((btVector3 *)&stack0xffffffffffffffd0);
    pbVar1 = btVector3::getZ((btVector3 *)&stack0xffffffffffffffd0);
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(*pbVar1 * (1.0 / bVar2),bVar2 * 0.5),
               in_stack_ffffffffffffff88->m_floats,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,(btScalar *)0x1fdfbc);
  }
  else {
    btVector3::btVector3(&local_44);
    btVector3::btVector3(&local_54);
    btPlaneSpace1<btVector3>(in_RSI,bVar3.m_floats._8_8_,bVar3.m_floats._0_8_);
    pbVar1 = btVector3::x(&local_44);
    _x = btVector3::y(&local_44);
    btVector3::z(&local_44);
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),_x,
               pbVar1,in_stack_ffffffffffffff78,(btScalar *)0x1fdefe);
  }
  return (btQuadWord)(btQuadWord)local_10.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btQuaternion 
shortestArcQuat(const btVector3& v0, const btVector3& v1) // Game Programming Gems 2.10. make sure v0,v1 are normalized
{
	btVector3 c = v0.cross(v1);
	btScalar  d = v0.dot(v1);

	if (d < -1.0 + SIMD_EPSILON)
	{
		btVector3 n,unused;
		btPlaneSpace1(v0,n,unused);
		return btQuaternion(n.x(),n.y(),n.z(),0.0f); // just pick any vector that is orthogonal to v0
	}

	btScalar  s = btSqrt((1.0f + d) * 2.0f);
	btScalar rs = 1.0f / s;

	return btQuaternion(c.getX()*rs,c.getY()*rs,c.getZ()*rs,s * 0.5f);
}